

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O2

void __thiscall LiteScript::String::String(String *this,char *data)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,data,&local_31);
  ConvertToUnicode(&this->str,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

LiteScript::String::String(const char * data) : str(String::ConvertToUnicode(std::string(data))) {}